

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int write_header(archive_write *a,archive_entry *entry)

{
  int64_t *piVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  int iVar5;
  archive_string_conv *sc;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t iVar9;
  archive_entry *in_RSI;
  archive_entry *in_RDI;
  int pad;
  size_t len;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  char h [110];
  int ret_final;
  int ret;
  int pathlength;
  char *path;
  char *p;
  cpio_conflict2 *cpio;
  int64_t ino;
  archive_entry *in_stack_fffffffffffffef8;
  archive_write *in_stack_ffffffffffffff00;
  archive_write *a_00;
  archive_entry *in_stack_ffffffffffffff08;
  archive_entry *in_stack_ffffffffffffff10;
  long local_d0;
  undefined1 local_b8 [120];
  int iVar10;
  int local_38;
  archive_write *local_28;
  
  piVar1 = (int64_t *)(in_RDI->ae_fflags_text).aes_mbs.length;
  iVar10 = 0;
  sc = get_sconv(in_stack_ffffffffffffff00);
  wVar2 = _archive_entry_pathname_l
                    (in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08,
                     (size_t *)in_stack_ffffffffffffff00,
                     (archive_string_conv *)in_stack_fffffffffffffef8);
  if (wVar2 != L'\0') {
    piVar6 = __errno_location();
    if (*piVar6 == 0xc) {
      archive_set_error((archive *)in_RDI,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    pcVar7 = archive_entry_pathname(in_stack_fffffffffffffef8);
    pcVar8 = archive_string_conversion_charset_name(sc);
    archive_set_error((archive *)in_RDI,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar7,pcVar8)
    ;
    iVar10 = -0x14;
  }
  iVar3 = (int)local_d0 + 1;
  memset(local_b8,0,0x6e);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_devmajor(in_stack_fffffffffffffef8);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_devminor(in_stack_fffffffffffffef8);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  iVar9 = archive_entry_ino64(in_RSI);
  if (0xffffffff < iVar9) {
    archive_set_error((archive *)in_RDI,0x22,"large inode number truncated");
    iVar10 = -0x14;
  }
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_mode(in_RSI);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_uid(in_RSI);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_gid(in_RSI);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  archive_entry_nlink(in_RSI);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  mVar4 = archive_entry_filetype(in_RSI);
  if ((mVar4 == 0x6000) || (mVar4 = archive_entry_filetype(in_RSI), mVar4 == 0x2000)) {
    archive_entry_rdevmajor(in_stack_fffffffffffffef8);
    format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    archive_entry_rdevminor(in_stack_fffffffffffffef8);
    format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  else {
    format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  archive_entry_mtime(in_RSI);
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  mVar4 = archive_entry_filetype(in_RSI);
  if (mVar4 != 0x8000) {
    archive_entry_set_size(in_RSI,0);
  }
  wVar2 = _archive_entry_symlink_l
                    (in_stack_ffffffffffffff08,(char **)in_stack_ffffffffffffff00,
                     (size_t *)in_stack_fffffffffffffef8,(archive_string_conv *)0x17003f);
  if (wVar2 != L'\0') {
    piVar6 = __errno_location();
    if (*piVar6 == 0xc) {
      archive_set_error((archive *)in_RDI,0xc,"Can\'t allocate memory for Likname");
      return -0x1e;
    }
    in_stack_ffffffffffffff08 = in_RDI;
    in_stack_ffffffffffffff10 = (archive_entry *)archive_entry_symlink(in_stack_fffffffffffffef8);
    pcVar7 = archive_string_conversion_charset_name(sc);
    archive_set_error((archive *)in_stack_ffffffffffffff08,0x54,
                      "Can\'t translate linkname \'%s\' to %s",in_stack_ffffffffffffff10,pcVar7);
    iVar10 = -0x14;
  }
  if (((local_d0 == 0) || (local_28 == (archive_write *)0x0)) ||
     ((char)(local_28->archive).magic == '\0')) {
    archive_entry_size(in_RSI);
    local_38 = format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  else {
    strlen((char *)local_28);
    local_38 = format_hex((int64_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  if (local_38 == 0) {
    iVar5 = __archive_write_output(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x1701a2);
    if (iVar5 == 0) {
      iVar5 = __archive_write_output(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x1701e0);
      if (iVar5 == 0) {
        if ((((iVar3 + 0x6eU ^ 0xffffffff) + 1 & 3) == 0) ||
           (iVar3 = __archive_write_output
                              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0x170238),
           iVar3 == 0)) {
          iVar9 = archive_entry_size(in_RSI);
          *piVar1 = iVar9;
          *(uint *)(piVar1 + 1) = ((uint)*piVar1 ^ 0xffffffff) + 1 & 3;
          if ((local_28 != (archive_write *)0x0) && ((char)(local_28->archive).magic != '\0')) {
            a_00 = local_28;
            strlen((char *)local_28);
            iVar3 = __archive_write_output(a_00,in_RDI,0x1702f4);
            if (iVar3 == 0) {
              strlen((char *)local_28);
              iVar3 = __archive_write_output(a_00,in_RDI,0x170348);
              if (iVar3 != 0) {
                iVar10 = -0x1e;
              }
            }
            else {
              iVar10 = -0x1e;
            }
          }
        }
        else {
          iVar10 = -0x1e;
        }
      }
      else {
        iVar10 = -0x1e;
      }
    }
    else {
      iVar10 = -0x1e;
    }
  }
  else {
    archive_set_error((archive *)in_RDI,0x22,"File is too large for this format.");
    iVar10 = -0x19;
  }
  return iVar10;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	char h[76];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null. */
	pathlength = (int)len + 1;

	memset(h, 0, sizeof(h));
	format_octal(070707, h + c_magic_offset, c_magic_size);
	format_octal(archive_entry_dev(entry), h + c_dev_offset, c_dev_size);

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 0777777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	format_octal(ino & 0777777, h + c_ino_offset, c_ino_size);

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_octal(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_octal(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_octal(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_octal(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
	    format_octal(archive_entry_dev(entry), h + c_rdev_offset, c_rdev_size);
	else
	    format_octal(0, h + c_rdev_offset, c_rdev_size);
	format_octal(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_octal(pathlength, h + c_namesize_offset, c_namesize_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_octal(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_octal(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for cpio format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, sizeof(h));
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}